

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldStateTest_SwapClean_Test::TestBody
          (MapFieldStateTest_SwapClean_Test *this)

{
  MapFieldType *map_field;
  int in_R8D;
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  other;
  
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::ArenaHolder(&other,(this->super_MapFieldStateTest).arena_._M_t.
                       super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
                       .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl);
  MapFieldStateTest::AddOneStillClean(&this->super_MapFieldStateTest,other.field_);
  MapFieldBase::Swap((MapFieldBase *)(this->super_MapFieldStateTest).map_field_.field_,
                     (MapFieldBase *)other.field_);
  MapFieldStateTest::Expect
            ((MapFieldStateTest *)(this->super_MapFieldStateTest).map_field_.field_,
             (MapFieldType *)0x0,MAP_DIRTY,1,in_R8D);
  map_field = (MapFieldType *)(ulong)(this->super_MapFieldStateTest).state_;
  if (map_field < (MapFieldType *)0x3) {
    MapFieldStateTest::Expect
              ((MapFieldStateTest *)other.field_,map_field,
               *(State *)(&DAT_00e03068 + (long)map_field * 4),
               *(int *)(&DAT_00e01e40 + (long)map_field * 4),in_R8D);
  }
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::~ArenaHolder(&other);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, SwapClean) {
  ArenaHolder<MapFieldType> other(arena_.get());
  AddOneStillClean(other.get());

  map_field_->Swap(other.get());

  Expect(map_field_.get(), CLEAN, 1, 1);

  switch (state_) {
    case CLEAN:
      Expect(other.get(), CLEAN, 1, 1);
      break;
    case MAP_DIRTY:
      Expect(other.get(), MAP_DIRTY, 1, 0);
      break;
    case REPEATED_DIRTY:
      Expect(other.get(), REPEATED_DIRTY, 0, 1);
      break;
    default:
      break;
  }
}